

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlsearch.c
# Opt level: O3

XMLNode * XMLSearch_next(XMLNode *from,XMLSearch *search)

{
  int iVar1;
  XMLNode *pXVar2;
  XMLSearch *search_00;
  
  do {
    if (from == (XMLNode *)0x0) {
      return (XMLNode *)0x0;
    }
    if (search == (XMLSearch *)0x0) {
      return (XMLNode *)0x0;
    }
    do {
      search_00 = search;
      search = search_00->next;
    } while (search_00->next != (_XMLSearch *)0x0);
    if (search_00->stop_at == (XMLNode *)0xffffffffffffffff) {
      pXVar2 = XMLNode_next_sibling(from);
      search_00->stop_at = pXVar2;
    }
    from = XMLNode_next(from);
    if (from == search_00->stop_at) {
      return (XMLNode *)0x0;
    }
    while (iVar1 = XMLSearch_node_matches(from,search_00), iVar1 == 0) {
      from = XMLNode_next(from);
      if (from == search_00->stop_at) {
        return (XMLNode *)0x0;
      }
    }
    search = search_00->next;
  } while (search != (XMLSearch *)0x0);
  return from;
}

Assistant:

XMLNode* XMLSearch_next(const XMLNode* from, XMLSearch* search)
{
	XMLNode* node;

	if (search == NULL || from == NULL)
		return NULL;

	/* Go down the last child search as fathers will be tested recursively by the 'XMLSearch_node_matches' function */
	for (; search->next != NULL; search = search->next) ;

	/* Initialize the 'stop_at' node on first search, to remember where to stop as there will be multiple calls */
	/* 'stop_at' can be NULL when 'from' is a root node, that is why it should be initialized with something else than NULL */
	if (search->stop_at == INVALID_XMLNODE_POINTER)
		search->stop_at = XMLNode_next_sibling(from);

	for (node = XMLNode_next(from); node != search->stop_at; node = XMLNode_next(node)) { /* && node != NULL */
		if (!XMLSearch_node_matches(node, search))
			continue;

		/* 'node' is a matching node */

		/* No search to perform on 'node' children => 'node' is returned */
		if (search->next == NULL)
			return node;

		/* Run the search on 'node' children */
		return XMLSearch_next(node, search->next);
	}

	return NULL;
}